

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

void __thiscall
google::LogMessage::Init
          (LogMessage *this,char *file,int line,LogSeverity severity,SendMethod send_method)

{
  LogMessageTime *pLVar1;
  pointer pcVar2;
  code *pcVar3;
  int iVar4;
  undefined1 *puVar5;
  LogMessageData *pLVar6;
  int *piVar7;
  time_point now;
  char *pcVar8;
  long *this_00;
  _func_int **pp_Var9;
  pthread_t pVar10;
  size_t sVar11;
  LogStream *pLVar12;
  ostream *poVar13;
  long lVar14;
  LogMessageTime *pLVar15;
  LogMessageTime *pLVar16;
  undefined8 in_R9;
  _func_int *p_Var17;
  long *in_FS_OFFSET;
  byte bVar18;
  string stacktrace;
  ios saved_fmt;
  string local_168;
  LogMessageTime *local_148;
  LogMessageTime *local_140;
  LogMessageTime local_138 [3];
  
  bVar18 = 0;
  this->allocated_ = (LogMessageData *)0x0;
  if ((severity == FATAL) && (exit_on_dfatal != '\0')) {
    iVar4 = pthread_mutex_lock((pthread_mutex_t *)fatal_msg_lock);
    if (iVar4 != 0) {
      std::__throw_system_error(iVar4);
    }
    if (fatal_msg_exclusive == '\0') {
      fatal_msg_exclusive = '\x01';
      fatal_msg_data_exclusive[0x76e1] = 1;
      puVar5 = fatal_msg_data_exclusive;
    }
    else {
      DAT_00140b59 = 0;
      puVar5 = (undefined1 *)&fatal_msg_data_shared;
    }
    this->data_ = (LogMessageData *)puVar5;
    pthread_mutex_unlock((pthread_mutex_t *)fatal_msg_lock);
    pLVar6 = this->data_;
  }
  else {
    lVar14 = *in_FS_OFFSET;
    if (*(char *)(lVar14 + -0x76f0) == '\x01') {
      *(undefined1 *)(lVar14 + -0x76f0) = 0;
      pLVar6 = (LogMessageData *)(lVar14 + -0x76e8);
      LogMessageData::LogMessageData(pLVar6);
    }
    else {
      pLVar6 = (LogMessageData *)operator_new(0x76e8);
      LogMessageData::LogMessageData(pLVar6);
      this->allocated_ = pLVar6;
    }
    this->data_ = pLVar6;
    pLVar6->first_fatal_ = false;
  }
  piVar7 = __errno_location();
  pLVar6->preserved_errno_ = *piVar7;
  pLVar6->severity_ = severity;
  pLVar6->line_ = line;
  pLVar6->send_method_ = send_method;
  *(undefined8 *)&pLVar6->field_0x76a8 = in_R9;
  (pLVar6->field_6).sink_ = (LogSink *)0x0;
  (this->data_->field_6).sink_ = (LogSink *)0x0;
  now.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  LogMessageTime::LogMessageTime(local_138,now);
  pLVar1 = &this->time_;
  pLVar15 = local_138;
  pLVar16 = pLVar1;
  for (lVar14 = 10; lVar14 != 0; lVar14 = lVar14 + -1) {
    iVar4 = (pLVar15->tm_).tm_min;
    (pLVar16->tm_).tm_sec = (pLVar15->tm_).tm_sec;
    (pLVar16->tm_).tm_min = iVar4;
    pLVar15 = (LogMessageTime *)((long)pLVar15 + (ulong)bVar18 * -0x10 + 8);
    pLVar16 = (LogMessageTime *)((long)pLVar16 + (ulong)bVar18 * -0x10 + 8);
  }
  pLVar6 = this->data_;
  pLVar6->num_chars_to_log_ = 0;
  pLVar6->num_chars_to_syslog_ = 0;
  pcVar8 = glog_internal_namespace_::const_basename(file);
  pLVar6 = this->data_;
  pLVar6->basename_ = pcVar8;
  pLVar6->fullname_ = file;
  pLVar6->has_been_flushed_ = false;
  if ((line != -1) && (fLB::FLAGS_log_prefix != '\0')) {
    std::ios::ios((ios *)local_138,(streambuf *)0x0);
    std::ios::copyfmt((ios *)local_138);
    pcVar8 = this->data_->message_text_ +
             (long)((this->data_->stream_).super_ostream._vptr_basic_ostream[-3] + -4);
    if (pcVar8[0x7619] == '\0') {
      std::ios::widen((char)pcVar8 + '8');
      pcVar8[0x7619] = 1;
    }
    pcVar8[0x7618] = 0x30;
    pcVar3 = (anonymous_namespace)::custom_prefix_callback;
    pLVar6 = this->data_;
    local_140 = pLVar1;
    if ((anonymous_namespace)::custom_prefix_callback == (code *)0x0) {
      local_168._M_dataplus._M_p._0_1_ = **(undefined1 **)(LogSeverityNames + (ulong)severity * 8);
      std::__ostream_insert<char,std::char_traits<char>>
                (&(pLVar6->stream_).super_ostream,(char *)&local_168,1);
      pLVar1 = local_140;
      if (fLB::FLAGS_log_year_in_prefix == '\x01') {
        pLVar6 = this->data_;
        *(undefined8 *)
         ((pLVar6->stream_).super_ostream._vptr_basic_ostream[-3] + 0x10 +
         (long)&(pLVar6->stream_).super_ostream._vptr_basic_ostream) = 4;
        std::ostream::operator<<(&pLVar6->stream_,(this->time_).tm_.tm_year + 0x76c);
      }
      pLVar6 = this->data_;
      *(undefined8 *)
       ((pLVar6->stream_).super_ostream._vptr_basic_ostream[-3] + 0x10 +
       (long)&(pLVar6->stream_).super_ostream._vptr_basic_ostream) = 2;
      this_00 = (long *)std::ostream::operator<<(&pLVar6->stream_,(this->time_).tm_.tm_mon + 1);
      *(undefined8 *)((long)this_00 + *(long *)(*this_00 + -0x18) + 0x10) = 2;
      poVar13 = (ostream *)std::ostream::operator<<(this_00,(this->time_).tm_.tm_mday);
      local_168._M_dataplus._M_p._0_1_ = 0x20;
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)&local_168,1);
      *(undefined8 *)(&poVar13->field_0x10 + (long)poVar13->_vptr_basic_ostream[-3]) = 2;
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,(this->time_).tm_.tm_hour);
      local_168._M_dataplus._M_p._0_1_ = 0x3a;
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)&local_168,1);
      *(undefined8 *)(&poVar13->field_0x10 + (long)poVar13->_vptr_basic_ostream[-3]) = 2;
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,(this->time_).tm_.tm_min);
      local_168._M_dataplus._M_p._0_1_ = 0x3a;
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)&local_168,1);
      *(undefined8 *)(&poVar13->field_0x10 + (long)poVar13->_vptr_basic_ostream[-3]) = 2;
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,(pLVar1->tm_).tm_sec);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,".",1);
      *(undefined8 *)(&poVar13->field_0x10 + (long)poVar13->_vptr_basic_ostream[-3]) = 6;
      poVar13 = std::ostream::_M_insert<long>((long)poVar13);
      local_168._M_dataplus._M_p._0_1_ = 0x20;
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)&local_168,1);
      pp_Var9 = poVar13->_vptr_basic_ostream;
      p_Var17 = (_func_int *)((long)&poVar13->_vptr_basic_ostream + (long)pp_Var9[-3]);
      if ((&poVar13->field_0xe1)[(long)pp_Var9[-3]] == '\0') {
        std::ios::widen((char)p_Var17);
        p_Var17[0xe1] = (code)0x1;
        pp_Var9 = poVar13->_vptr_basic_ostream;
      }
      p_Var17[0xe0] = (code)0x20;
      *(undefined8 *)(&poVar13->field_0x10 + (long)pp_Var9[-3]) = 5;
      pVar10 = pthread_self();
      if (pVar10 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar13,"thread::id of a non-executing thread",0x24);
      }
      else {
        poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
      }
      p_Var17 = (_func_int *)
                ((long)&poVar13->_vptr_basic_ostream + (long)poVar13->_vptr_basic_ostream[-3]);
      if ((&poVar13->field_0xe1)[(long)poVar13->_vptr_basic_ostream[-3]] == '\0') {
        std::ios::widen((char)p_Var17);
        p_Var17[0xe1] = (code)0x1;
      }
      p_Var17[0xe0] = (code)0x30;
      local_168._M_dataplus._M_p._0_1_ = 0x20;
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)&local_168,1);
      pcVar8 = this->data_->basename_;
      if (pcVar8 == (char *)0x0) {
        std::ios::clear((int)poVar13 + (int)poVar13->_vptr_basic_ostream[-3]);
      }
      else {
        sVar11 = strlen(pcVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar8,sVar11);
      }
      local_168._M_dataplus._M_p._0_1_ = 0x3a;
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>(poVar13,(char *)&local_168,1);
      pLVar12 = (LogStream *)std::ostream::operator<<(poVar13,this->data_->line_);
      lVar14 = 2;
      pcVar8 = "] ";
    }
    else {
      pcVar2 = *(pointer *)(LogSeverityNames + (ulong)severity * 8);
      pcVar8 = pLVar6->basename_;
      local_168.field_2._8_8_ = pthread_self();
      local_148 = local_140;
      local_168._M_dataplus._M_p = pcVar2;
      local_168._M_string_length = (size_type)pcVar8;
      local_168.field_2._M_allocated_capacity = (size_type)&pLVar6->line_;
      (*pcVar3)(&pLVar6->stream_,&local_168,(anonymous_namespace)::custom_prefix_callback_data);
      pLVar12 = &this->data_->stream_;
      lVar14 = 1;
      pcVar8 = " ";
    }
    std::__ostream_insert<char,std::char_traits<char>>(&pLVar12->super_ostream,pcVar8,lVar14);
    std::ios::copyfmt((ios *)((this->data_->stream_).super_ostream._vptr_basic_ostream[-3] +
                             (long)&(this->data_->stream_).super_ostream._vptr_basic_ostream));
    std::ios_base::~ios_base((ios_base *)local_138);
    pLVar6 = this->data_;
  }
  pLVar6->num_prefix_chars_ =
       *(long *)&(pLVar6->stream_).super_ostream.field_0x30 -
       *(long *)&(pLVar6->stream_).super_ostream.field_0x28;
  if (fLS::FLAGS_log_backtrace_at_buf_abi_cxx11_._8_8_ != 0) {
    snprintf((char *)local_138,0x80,"%s:%d",pLVar6->basename_,(ulong)(uint)line);
    iVar4 = std::__cxx11::string::compare(fLS::FLAGS_log_backtrace_at_buf_abi_cxx11_);
    if (iVar4 == 0) {
      local_168._M_string_length = 0;
      local_168.field_2._M_allocated_capacity =
           local_168.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      glog_internal_namespace_::DumpStackTraceToString(&local_168);
      pLVar12 = &this->data_->stream_;
      std::__ostream_insert<char,std::char_traits<char>>
                (&pLVar12->super_ostream," (stacktrace:\n",0xe);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          (&pLVar12->super_ostream,local_168._M_dataplus._M_p,
                           local_168._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,") ",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void LogMessage::Init(const char* file, int line, LogSeverity severity,
                      void (LogMessage::*send_method)()) {
  allocated_ = nullptr;
  if (severity != GLOG_FATAL || !exit_on_dfatal) {
#ifdef GLOG_THREAD_LOCAL_STORAGE
    // No need for locking, because this is thread local.
    if (thread_data_available) {
      thread_data_available = false;
      data_ = new (&thread_msg_data) LogMessageData;
    } else {
      allocated_ = new LogMessageData();
      data_ = allocated_;
    }
#else   // !defined(GLOG_THREAD_LOCAL_STORAGE)
    allocated_ = new LogMessageData();
    data_ = allocated_;
#endif  // defined(GLOG_THREAD_LOCAL_STORAGE)
    data_->first_fatal_ = false;
  } else {
    std::lock_guard<std::mutex> l{fatal_msg_lock};
    if (fatal_msg_exclusive) {
      fatal_msg_exclusive = false;
      data_ = &fatal_msg_data_exclusive;
      data_->first_fatal_ = true;
    } else {
      data_ = &fatal_msg_data_shared;
      data_->first_fatal_ = false;
    }
  }

  data_->preserved_errno_ = errno;
  data_->severity_ = severity;
  data_->line_ = line;
  data_->send_method_ = send_method;
  data_->sink_ = nullptr;
  data_->outvec_ = nullptr;

  const auto now = std::chrono::system_clock::now();
  time_ = LogMessageTime(now);

  data_->num_chars_to_log_ = 0;
  data_->num_chars_to_syslog_ = 0;
  data_->basename_ = const_basename(file);
  data_->fullname_ = file;
  data_->has_been_flushed_ = false;

  // If specified, prepend a prefix to each line.  For example:
  //    I20201018 160715 f5d4fbb0 logging.cc:1153]
  //    (log level, GMT year, month, date, time, thread_id, file basename, line)
  // We exclude the thread_id for the default thread.
  if (FLAGS_log_prefix && (line != kNoLogPrefix)) {
    std::ios saved_fmt(nullptr);
    saved_fmt.copyfmt(stream());
    stream().fill('0');
    if (custom_prefix_callback == nullptr) {
      stream() << LogSeverityNames[severity][0];
      if (FLAGS_log_year_in_prefix) {
        stream() << setw(4) << 1900 + time_.year();
      }
      stream() << setw(2) << 1 + time_.month() << setw(2) << time_.day() << ' '
               << setw(2) << time_.hour() << ':' << setw(2) << time_.min()
               << ':' << setw(2) << time_.sec() << "." << setw(6)
               << time_.usec() << ' ' << setfill(' ') << setw(5)
               << std::this_thread::get_id() << setfill('0') << ' '
               << data_->basename_ << ':' << data_->line_ << "] ";
    } else {
      custom_prefix_callback(
          stream(),
          LogMessageInfo(LogSeverityNames[severity], data_->basename_,
                         data_->line_, std::this_thread::get_id(), time_),
          custom_prefix_callback_data);
      stream() << " ";
    }
    stream().copyfmt(saved_fmt);
  }
  data_->num_prefix_chars_ = data_->stream_.pcount();

  if (!FLAGS_log_backtrace_at.empty()) {
    char fileline[128];
    std::snprintf(fileline, sizeof(fileline), "%s:%d", data_->basename_, line);
#ifdef HAVE_STACKTRACE
    if (FLAGS_log_backtrace_at == fileline) {
      string stacktrace;
      DumpStackTraceToString(&stacktrace);
      stream() << " (stacktrace:\n" << stacktrace << ") ";
    }
#endif
  }
}